

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O1

tommy_trie_inplace_node *
trie_inplace_bucket_remove
          (tommy_uint_t shift,tommy_trie_inplace_node **let_ptr,tommy_trie_inplace_node *remove,
          tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node *head;
  tommy_trie_inplace_node *ptVar2;
  long lVar3;
  tommy_trie_inplace_node *ptVar4;
  byte bVar5;
  tommy_trie_inplace_node_struct **pptVar6;
  tommy_trie_inplace_node *ptVar7;
  tommy_trie_inplace_node_struct *ptVar8;
  uint uVar9;
  undefined4 in_register_0000003c;
  tommy_trie_inplace_node_struct *ptVar10;
  uint uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  
  ptVar10 = (tommy_trie_inplace_node_struct *)CONCAT44(in_register_0000003c,shift);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar4 = ptVar10->next;
  if (ptVar4 == (tommy_trie_inplace_node *)0x0) {
LAB_001106e7:
    let_ptr = (tommy_trie_inplace_node **)0x0;
  }
  else {
    uVar11 = (uint)remove;
    if (ptVar4->key != uVar11) {
      bVar5 = 0x1a;
      do {
        ptVar2 = ptVar4;
        uVar9 = uVar11 >> (bVar5 & 0x1f) & 3;
        ptVar4 = ptVar2->map[uVar9];
        if (ptVar4 == (tommy_trie_inplace_node_struct *)0x0) goto LAB_001106e7;
        bVar5 = bVar5 - 2;
      } while (ptVar4->key != uVar11);
      ptVar10 = (tommy_trie_inplace_node_struct *)(ptVar2->map + uVar9);
    }
    if (let_ptr == (tommy_trie_inplace_node **)0x0) {
      let_ptr = &ptVar4->next;
    }
    ptVar2 = ((tommy_trie_inplace_node *)let_ptr)->next;
    ptVar7 = ptVar2;
    if (ptVar2 == (tommy_trie_inplace_node *)0x0) {
      ptVar7 = ptVar4;
    }
    ptVar7->prev = ((tommy_trie_inplace_node *)let_ptr)->prev;
    ptVar8 = ptVar10;
    if (ptVar4 != (tommy_trie_inplace_node *)let_ptr) {
      ptVar8 = ((tommy_trie_inplace_node *)let_ptr)->prev;
    }
    ptVar8->next = ptVar2;
    ptVar2 = ptVar10->next;
    if (ptVar2 != ptVar4) {
      if (ptVar2 == (tommy_trie_inplace_node *)0x0) {
        pptVar6 = (tommy_trie_inplace_node_struct **)0x0;
        ptVar4 = (tommy_trie_inplace_node *)let_ptr;
        do {
          uVar11 = 3;
          while( true ) {
            if (ptVar4->map[uVar11] != (tommy_trie_inplace_node_struct *)0x0) break;
            bVar12 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar12) {
              if (pptVar6 != (tommy_trie_inplace_node_struct **)0x0) {
                *pptVar6 = (tommy_trie_inplace_node_struct *)0x0;
                lVar3 = 4;
                do {
                  ptVar4->map[lVar3 + -4] = ((tommy_trie_inplace_node *)let_ptr)->map[lVar3 + -4];
                  lVar3 = lVar3 + 1;
                } while (lVar3 != 8);
                ptVar10->next = ptVar4;
              }
              goto LAB_001106e9;
            }
          }
          pptVar6 = ptVar4->map + uVar11;
          ptVar4 = ptVar4->map[uVar11];
        } while( true );
      }
      lVar3 = 4;
      do {
        ptVar2->map[lVar3 + -4] = ((tommy_trie_inplace_node *)let_ptr)->map[lVar3 + -4];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
    }
  }
LAB_001106e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (tommy_trie_inplace_node *)let_ptr;
}

Assistant:

static tommy_trie_inplace_node* trie_inplace_bucket_remove(tommy_uint_t shift, tommy_trie_inplace_node** let_ptr, tommy_trie_inplace_node* remove, tommy_key_t key)
{
	tommy_trie_inplace_node* node;
	int i;
	tommy_trie_inplace_node** leaf_let_ptr;
	tommy_trie_inplace_node* leaf;

	node = *let_ptr;
	while (node && node->key != key) {
		let_ptr = &node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		node = *let_ptr;
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	if (!node)
		return 0;

	/* if the node to remove is not specified */
	if (!remove)
		remove = node; /* remove the first */

	tommy_trie_inplace_list_remove(let_ptr, remove);

	/* if not change in the node, nothing more to do */
	if (*let_ptr == node)
		return remove;

	/* if we have a substitute */
	if (*let_ptr != 0) {
		/* copy the child pointers to the new one */
		node = *let_ptr;
		for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
			node->map[i] = remove->map[i];

		return remove;
	}

	/* find a leaf */
	leaf_let_ptr = 0;
	leaf = remove;

	/* search backward, statistically we have more zeros than ones */
	i = TOMMY_TRIE_INPLACE_TREE_MAX - 1;
	while (i >= 0) {
		if (leaf->map[i]) {
			leaf_let_ptr = &leaf->map[i];
			leaf = *leaf_let_ptr;
			i = TOMMY_TRIE_INPLACE_TREE_MAX - 1;
			continue;
		}
		--i;
	}

	/* if it's itself a leaf */
	if (!leaf_let_ptr)
		return remove;

	/* remove the leaf */
	*leaf_let_ptr = 0;

	/* copy the child pointers */
	for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
		leaf->map[i] = remove->map[i];

	/* put it in place */
	*let_ptr = leaf;

	return remove;
}